

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O3

void find_path(PATHFIND_DATA *path,ROOM_INDEX_DATA *goal)

{
  ROOM_INDEX_DATA *pRVar1;
  EXIT_DATA *pEVar2;
  PATHFIND_DATA *pPVar3;
  ROOM_INDEX_DATA *pRVar4;
  bool bVar5;
  long lVar6;
  int i;
  long lVar7;
  
  path->evaluated = true;
  iterations = iterations + 1;
  pRVar4 = path->room;
  if (pRVar4 == goal) {
    if ((best_path != (PATHFIND_DATA *)0x0) && (best_path->steps <= path->steps)) {
      return;
    }
    best_path = path;
    return;
  }
  lVar7 = 0;
  bVar5 = false;
LAB_0025752b:
  lVar6 = lVar7 + 7;
  do {
    if ((best_path != (PATHFIND_DATA *)0x0) && (best_path->steps < 2)) break;
    if ((pRVar4->exit[lVar6 + -7] != (EXIT_DATA *)0x0) &&
       ((pRVar1 = (pRVar4->exit[lVar6 + -7]->u1).to_room, pRVar1 != (ROOM_INDEX_DATA *)0x0 &&
        (pRVar1->area == goal->area)))) {
      pPVar3 = pRVar1->path;
      if (pPVar3 == (PATHFIND_DATA *)0x0) break;
      if (((path->steps + 1 < pPVar3->steps) || (pPVar3->evaluated == false)) &&
         ((path->steps < pPVar3->steps || (pPVar3->evaluated != false)))) break;
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 0xd) {
      if (!bVar5) {
        path->dir_to[4] = (PATHFIND_DATA *)0x0;
        path->dir_to[5] = (PATHFIND_DATA *)0x0;
        path->dir_to[2] = (PATHFIND_DATA *)0x0;
        path->dir_to[3] = (PATHFIND_DATA *)0x0;
        path->dir_to[0] = (PATHFIND_DATA *)0x0;
        path->dir_to[1] = (PATHFIND_DATA *)0x0;
        return;
      }
      goto LAB_002575a8;
    }
  } while( true );
  lVar7 = lVar6 + -6;
  bVar5 = true;
  if (lVar6 == 0xc) goto LAB_002575a8;
  goto LAB_0025752b;
LAB_002575a8:
  lVar7 = 0;
  do {
    if (((pRVar4->exit[lVar7] != (EXIT_DATA *)0x0) &&
        (pRVar1 = (pRVar4->exit[lVar7]->u1).to_room, pRVar1 != (ROOM_INDEX_DATA *)0x0)) &&
       (pRVar1->area == goal->area)) {
      pPVar3 = pRVar1->path;
      if (pPVar3 != (PATHFIND_DATA *)0x0) {
        if (((pPVar3->steps <= path->steps + 1) && (pPVar3->evaluated != false)) ||
           ((pPVar3->steps <= path->steps && (pPVar3->evaluated != true)))) goto LAB_0025762a;
      }
      pPVar3 = new_path_data();
      pPVar3->room = (ROOM_INDEX_DATA *)path->room->exit[lVar7]->u1;
      pPVar3->dir_from = (int)lVar7;
      pPVar3->steps = path->steps + 1;
      pPVar3->prev = path;
      path->dir_to[lVar7] = pPVar3;
      pRVar4 = path->room;
      ((pRVar4->exit[lVar7]->u1).to_room)->path = pPVar3;
    }
LAB_0025762a:
    lVar7 = lVar7 + 1;
    if (lVar7 == 6) {
      lVar7 = 7;
      do {
        pEVar2 = path->room->exit[lVar7 + -7];
        if (((pEVar2 != (EXIT_DATA *)0x0) && (path->dir_to[lVar7 + -7] != (PATHFIND_DATA *)0x0)) &&
           ((pRVar4 = (pEVar2->u1).to_room, pRVar4 != (ROOM_INDEX_DATA *)0x0 &&
            ((pRVar4->area == goal->area && (pRVar4->path->evaluated == false)))))) {
          find_path(path->dir_to[lVar7 + -7],goal);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0xd);
      return;
    }
  } while( true );
}

Assistant:

void find_path(PATHFIND_DATA *path, ROOM_INDEX_DATA *goal)
{
	path->evaluated = true;
	iterations++;

	if (path->room == goal)
	{
		if (!best_path || best_path->steps > path->steps)
			best_path = path;

		return;
	}

	auto found = false;
	for (auto i = 0; i < 6; i++)
	{
		if ((best_path && best_path->steps < 2)
			|| (path->room->exit[i] 
				&& path->room->exit[i]->u1.to_room
				&& path->room->exit[i]->u1.to_room->area == goal->area
				&& !(path->room->exit[i]->u1.to_room->path
					&& path->room->exit[i]->u1.to_room->path->steps <= path->steps + 1
					&& path->room->exit[i]->u1.to_room->path->evaluated)
				&& !(path->room->exit[i]->u1.to_room->path
					&& path->room->exit[i]->u1.to_room->path->steps < path->steps + 1
					&& !path->room->exit[i]->u1.to_room->path->evaluated)))
		{
			found = true;
		}
	}

	if (!found)
	{
		for (auto i = 0; i < 6; i++)
		{
			path->dir_to[i] = nullptr;
		}

		return;
	}

	for (auto i = 0; i < 6; i++)
	{
		if (!path->room->exit[i]
			|| !path->room->exit[i]->u1.to_room
			|| path->room->exit[i]->u1.to_room->area != goal->area
			|| (path->room->exit[i]->u1.to_room->path 
				&& path->room->exit[i]->u1.to_room->path->steps <= path->steps + 1 
				&& path->room->exit[i]->u1.to_room->path->evaluated)
			|| (path->room->exit[i]->u1.to_room->path
				&& path->room->exit[i]->u1.to_room->path->steps < path->steps + 1
				&& !path->room->exit[i]->u1.to_room->path->evaluated))
		{
			continue;
		}

		auto next_path = new_path_data();
		next_path->room = path->room->exit[i]->u1.to_room;
		next_path->dir_from = i;
		next_path->steps = path->steps + 1;
		next_path->prev = path;

		path->dir_to[i] = next_path;
		path->room->exit[i]->u1.to_room->path = next_path;
	}

	for (auto i = 0; i < 6; i++)
	{
		if (!path->room->exit[i]
			|| !path->dir_to[i]
			|| !path->room->exit[i]->u1.to_room
			|| path->room->exit[i]->u1.to_room->area != goal->area
			|| path->room->exit[i]->u1.to_room->path->evaluated)
		{
			continue;
		}

		find_path(path->dir_to[i], goal);
	}
}